

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_section_fixups.cpp
# Opt level: O0

void __thiscall
ExternalFixupMembersImport_Addend_Test::~ExternalFixupMembersImport_Addend_Test
          (ExternalFixupMembersImport_Addend_Test *this)

{
  ExternalFixupMembersImport_Addend_Test *this_local;
  
  ~ExternalFixupMembersImport_Addend_Test(this);
  operator_delete(this,0x150);
  return;
}

Assistant:

TEST_F (ExternalFixupMembersImport, Addend) {
    mock_mutex mutex;
    auto transaction = begin (db_, transaction_lock{mutex});
    pstore::exchange::import_ns::string_mapping imported_names;
    ASSERT_EQ (imported_names.add_string (&transaction, "name"), std::error_code{});

    // The "addend" key is missing altogether. That's okay: the default is 0.
    {
        external_fixup_collection fixups;
        auto const parser1 =
            this->parse (R"({ "name":0, "type":17, "offset":19 })", &db_, imported_names, &fixups);
        EXPECT_FALSE (parser1.has_error ())
            << "JSON error was: " << parser1.last_error ().message ();
        ASSERT_EQ (fixups.size (), 1U);
        EXPECT_EQ (fixups[0].addend, 0);
    }
    // The "addend" key has the wrong type.
    {
        auto const parser2 = this->parse (R"({ "name":0, "type":17, "offset":19, "addend":true })",
                                          &db_, imported_names);
        EXPECT_TRUE (parser2.has_error ()) << "Expected the parse to fail";
        EXPECT_EQ (parser2.last_error (),
                   make_error_code (pstore::exchange::import_ns::error::unexpected_boolean));
    }
}